

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_add(REF_CELL ref_cell,REF_INT *nodes,REF_INT *new_cell)

{
  uint uVar1;
  REF_INT *__ptr;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  int reference;
  char *pcVar6;
  
  *new_cell = -1;
  reference = ref_cell->blank;
  if (reference == -1) {
    reference = ref_cell->max;
    if (reference == 0x1fffffff) {
      pcVar6 = "the number of cells is too large for integers, cannot grow";
      uVar4 = 0x2a8;
    }
    else {
      if (reference < 0x1fffffff) {
        uVar1 = 5000;
        if (5000 < (int)((double)reference * 1.5)) {
          uVar1 = (int)((double)reference * 1.5);
        }
        if (0x1fffffffU - reference <= uVar1) {
          uVar1 = 0x1fffffffU - reference;
        }
        ref_cell->max = uVar1 + reference;
        fflush(_stdout);
        uVar1 = ref_cell->max * ref_cell->size_per;
        __ptr = ref_cell->c2n;
        if (0 < (int)uVar1) {
          __ptr = (REF_INT *)realloc(__ptr,(ulong)uVar1 << 2);
          ref_cell->c2n = __ptr;
        }
        iVar2 = reference;
        if (__ptr == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x2b4,"ref_cell_add","realloc ref_cell->c2n NULL");
          uVar5 = (long)ref_cell->max * (long)ref_cell->size_per;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar5 & 0xffffffff,uVar5
                 ,4,uVar5 * 4);
          return 2;
        }
        while( true ) {
          if (ref_cell->max <= iVar2) break;
          __ptr[ref_cell->size_per * iVar2] = -1;
          __ptr[(long)iVar2 * (long)ref_cell->size_per + 1] = iVar2 + 1;
          iVar2 = iVar2 + 1;
        }
        __ptr[(long)(ref_cell->size_per * (ref_cell->max + -1)) + 1] = -1;
        ref_cell->blank = reference;
        goto LAB_0011d0cb;
      }
      pcVar6 = "chunk limit at max";
      uVar4 = 0x2ae;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_add",pcVar6);
    uVar1 = 1;
  }
  else {
    __ptr = ref_cell->c2n;
LAB_0011d0cb:
    iVar2 = ref_cell->size_per;
    ref_cell->blank = __ptr[(long)(iVar2 * reference) + 1];
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      __ptr[iVar2 * reference + (int)lVar3] = nodes[lVar3];
      iVar2 = ref_cell->size_per;
    }
    lVar3 = 0;
    do {
      if (ref_cell->node_per <= lVar3) {
        ref_cell->n = ref_cell->n + 1;
        *new_cell = reference;
        return 0;
      }
      uVar1 = ref_adj_add(ref_cell->ref_adj,nodes[lVar3],reference);
      lVar3 = lVar3 + 1;
    } while (uVar1 == 0);
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2c4,
           "ref_cell_add",(ulong)uVar1,"register cell");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_add(REF_CELL ref_cell, REF_INT *nodes,
                                REF_INT *new_cell) {
  REF_INT node, cell;
  REF_INT orig, chunk;
  REF_INT max_limit = REF_INT_MAX / 4;

  (*new_cell) = REF_EMPTY;

  if (REF_EMPTY == ref_cell_blank(ref_cell)) {
    RAS(ref_cell_max(ref_cell) != max_limit,
        "the number of cells is too large for integers, cannot grow");
    orig = ref_cell_max(ref_cell);
    /* geometric growth for efficiency */
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));

    /* try to keep under 32-bit limit */
    RAS(max_limit - orig > 0, "chunk limit at max");
    chunk = MIN(chunk, max_limit - orig);

    ref_cell_max(ref_cell) = orig + chunk;

    ref_realloc(ref_cell->c2n,
                ref_cell_size_per(ref_cell) * ref_cell_max(ref_cell), REF_INT);

    for (cell = orig; cell < ref_cell_max(ref_cell); cell++) {
      ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
      ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
    }
    ref_cell_c2n(ref_cell, 1, ref_cell_max(ref_cell) - 1) = REF_EMPTY;
    ref_cell_blank(ref_cell) = orig;
  }

  cell = ref_cell_blank(ref_cell);
  ref_cell_blank(ref_cell) = ref_cell_c2n(ref_cell, 1, cell);
  for (node = 0; node < ref_cell_size_per(ref_cell); node++)
    ref_cell_c2n(ref_cell, node, cell) = nodes[node];

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    RSS(ref_adj_add(ref_cell->ref_adj, nodes[node], cell), "register cell");

  ref_cell_n(ref_cell)++;

  (*new_cell) = cell;

  return REF_SUCCESS;
}